

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * rbuObjIterGetCollist(sqlite3rbu *p,RbuObjIter *pIter)

{
  char *z;
  char *pcStack_28;
  int i;
  char *zSep;
  char *zList;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  zSep = (char *)0x0;
  pcStack_28 = "";
  for (z._4_4_ = 0; z._4_4_ < pIter->nTblCol; z._4_4_ = z._4_4_ + 1) {
    zSep = rbuMPrintf(p,"%z%s\"%w\"",zSep,pcStack_28,pIter->azTblCol[z._4_4_]);
    pcStack_28 = ", ";
  }
  return zSep;
}

Assistant:

static char *rbuObjIterGetCollist(
  sqlite3rbu *p,                  /* RBU object */
  RbuObjIter *pIter               /* Object iterator for column names */
){
  char *zList = 0;
  const char *zSep = "";
  int i;
  for(i=0; i<pIter->nTblCol; i++){
    const char *z = pIter->azTblCol[i];
    zList = rbuMPrintf(p, "%z%s\"%w\"", zList, zSep, z);
    zSep = ", ";
  }
  return zList;
}